

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

int __thiscall Fl_Text_Display::scroll_(Fl_Text_Display *this,int topLineNum,int horizOffset)

{
  int iVar1;
  int newTopLineNum;
  
  newTopLineNum = (this->mNBufferLines - this->mNVisibleLines) + 3;
  if (topLineNum <= newTopLineNum) {
    newTopLineNum = topLineNum;
  }
  if (newTopLineNum < 2) {
    newTopLineNum = 1;
  }
  iVar1 = longest_vline(this);
  if (iVar1 - (this->text_area).w < horizOffset) {
    iVar1 = longest_vline(this);
    horizOffset = iVar1 - (this->text_area).w;
  }
  if (horizOffset < 1) {
    horizOffset = 0;
  }
  if ((this->mHorizOffset != horizOffset) || (iVar1 = 0, this->mTopLineNum != newTopLineNum)) {
    offset_line_starts(this,newTopLineNum);
    this->mHorizOffset = horizOffset;
    Fl_Widget::damage((Fl_Widget *)this,'\x02');
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Fl_Text_Display::scroll_(int topLineNum, int horizOffset) {
  /* Limit the requested scroll position to allowable values */
  if (topLineNum > mNBufferLines + 3 - mNVisibleLines)
    topLineNum = mNBufferLines + 3 - mNVisibleLines;
  if (topLineNum < 1) topLineNum = 1;

  if (horizOffset > longest_vline() - text_area.w)
    horizOffset = longest_vline() - text_area.w;
  if (horizOffset < 0) horizOffset = 0;

  /* Do nothing if scroll position hasn't actually changed or there's no
   window to draw in yet */
  if (mHorizOffset == horizOffset && mTopLineNum == topLineNum)
    return 0;

  /* If the vertical scroll position has changed, update the line
   starts array and related counters in the text display */
  offset_line_starts(topLineNum);

  /* Just setting mHorizOffset is enough information for redisplay */
  mHorizOffset = horizOffset;

  // redraw all text
  damage(FL_DAMAGE_EXPOSE);
  return 1;
}